

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_cancel_auto_extension(_func_void *xInit)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  sqlite3_mutex *psVar4;
  int iVar5;
  ulong uVar6;
  
  bVar3 = true;
  if (sqlite3Config.bCoreMutex != '\0') {
    psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar4 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar4);
      bVar3 = false;
      goto LAB_00151734;
    }
  }
  psVar4 = (sqlite3_mutex *)0x0;
LAB_00151734:
  uVar6 = (ulong)sqlite3Autoext_0;
  do {
    if ((int)uVar6 < 1) {
      iVar5 = 0;
      goto LAB_0015176d;
    }
    uVar1 = uVar6 - 1;
    lVar2 = uVar6 * 8;
    uVar6 = uVar1;
  } while (*(_func_void **)(sqlite3Autoext_1 + -8 + lVar2) != xInit);
  sqlite3Autoext_0 = sqlite3Autoext_0 - 1;
  *(undefined8 *)(sqlite3Autoext_1 + uVar1 * 8) =
       *(undefined8 *)(sqlite3Autoext_1 + (ulong)sqlite3Autoext_0 * 8);
  iVar5 = 1;
LAB_0015176d:
  if (!bVar3) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return iVar5;
}

Assistant:

SQLITE_API int sqlite3_cancel_auto_extension(
  void (*xInit)(void)
){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
  int i;
  int n = 0;
  wsdAutoextInit;
  sqlite3_mutex_enter(mutex);
  for(i=(int)wsdAutoext.nExt-1; i>=0; i--){
    if( wsdAutoext.aExt[i]==xInit ){
      wsdAutoext.nExt--;
      wsdAutoext.aExt[i] = wsdAutoext.aExt[wsdAutoext.nExt];
      n++;
      break;
    }
  }
  sqlite3_mutex_leave(mutex);
  return n;
}